

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O1

void __thiscall QDtls::QDtls(QDtls *this,SslMode mode,QObject *parent)

{
  long lVar1;
  long *plVar2;
  QDebug QVar3;
  QObjectPrivate *this_00;
  QTlsBackend *pQVar4;
  undefined8 uVar5;
  QLoggingCategory *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QArrayData *local_88;
  undefined8 *local_80;
  undefined1 local_70 [12];
  undefined8 uStack_64;
  undefined4 local_5c;
  char *local_58;
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QObjectPrivate *)operator_new(0x80);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QDtlsPrivate_002d6438;
  *(undefined8 *)(this_00 + 0x78) = 0;
  QObject::QObject(&this->super_QObject,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_002d6468;
  lVar1 = *(long *)&this->field_0x8;
  pQVar4 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar4 == (QTlsBackend *)0x0) {
    pQVar6 = QtPrivateLogging::lcSsl();
    if (((pQVar6->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      QDtls((QDtls *)pQVar6);
    }
  }
  else {
    uVar5 = (**(code **)(*(long *)pQVar4 + 0xd0))(pQVar4,this,mode);
    plVar2 = *(long **)(lVar1 + 0x78);
    *(undefined8 *)(lVar1 + 0x78) = uVar5;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    if (*(long *)(lVar1 + 0x78) == 0) {
      pQVar6 = QtPrivateLogging::lcSsl();
      if (((pQVar6->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_58 = pQVar6->name;
        local_70._0_4_ = 2;
        local_70._4_8_ = 0;
        uStack_64 = 0;
        local_5c = 0;
        QMessageLogger::warning();
        QVar3.stream = local_50.stream;
        QVar7.m_data = (storage_type *)0xb;
        QVar7.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar7);
        QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_50.stream,' ');
        }
        (**(code **)(*(long *)pQVar4 + 0x90))(&local_88,pQVar4);
        if (local_80 == (undefined8 *)0x0) {
          local_80 = &QString::_empty;
        }
        QDebug::putString((QChar *)&local_50,(ulong)local_80);
        if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_50.stream,' ');
        }
        QVar3.stream = local_50.stream;
        QVar8.m_data = (storage_type *)0x22;
        QVar8.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar8);
        QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_50.stream,' ');
        }
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88,2,0x10);
          }
        }
        QDebug::~QDebug(&local_50);
      }
    }
    QSslConfiguration::defaultDtlsConfiguration();
    setDtlsConfiguration(this,(QSslConfiguration *)local_70);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDtls::QDtls(QSslSocket::SslMode mode, QObject *parent)
    : QObject(*new QDtlsPrivate, parent)
{
    Q_D(QDtls);
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend found, QDtls is unsupported");
        return;
    }
    d->backend.reset(tlsBackend->createDtlsCryptograph(this, mode));
    if (!d->backend.get()) {
        qCWarning(lcSsl) << "TLS backend" << tlsBackend->backendName()
                         << "does not support the protocol DTLS";
    }
    setDtlsConfiguration(QSslConfiguration::defaultDtlsConfiguration());
}